

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

SourceLocation *
google::protobuf::internal::CheckNotNull<google::protobuf::SourceLocation>
          (char *file,int line,char *name,SourceLocation *val)

{
  LogMessage *other;
  LogFinisher local_6d [13];
  LogMessage local_60;
  SourceLocation *local_28;
  SourceLocation *val_local;
  char *name_local;
  char *pcStack_10;
  int line_local;
  char *file_local;
  
  local_28 = val;
  if (val == (SourceLocation *)0x0) {
    val_local = (SourceLocation *)name;
    name_local._4_4_ = line;
    pcStack_10 = file;
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
               ,0x2d5);
    other = LogMessage::operator<<(&local_60,(char *)val_local);
    LogFinisher::operator=(local_6d,other);
    LogMessage::~LogMessage(&local_60);
  }
  return local_28;
}

Assistant:

T* CheckNotNull(const char *file, int line, const char *name, T* val) {
  if (val == NULL) {
    GOOGLE_LOG(FATAL) << name;
  }
  return val;
}